

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

LY_ERR ly_set_rm(ly_set *set,void *object,_func_void_void_ptr *destructor)

{
  uint local_2c;
  uint32_t i;
  _func_void_void_ptr *destructor_local;
  void *object_local;
  ly_set *set_local;
  
  if (set == (ly_set *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","set","ly_set_rm");
    set_local._4_4_ = LY_EINVAL;
  }
  else if (object == (void *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","object","ly_set_rm");
    set_local._4_4_ = LY_EINVAL;
  }
  else {
    for (local_2c = 0;
        (local_2c < set->count && ((set->field_2).dnodes[local_2c] != (lyd_node *)object));
        local_2c = local_2c + 1) {
    }
    if (local_2c == set->count) {
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","object","ly_set_rm");
      set_local._4_4_ = LY_EINVAL;
    }
    else {
      set_local._4_4_ = ly_set_rm_index(set,local_2c,destructor);
    }
  }
  return set_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_set_rm(struct ly_set *set, void *object, void (*destructor)(void *obj))
{
    uint32_t i;

    LY_CHECK_ARG_RET(NULL, set, object, LY_EINVAL);

    /* get index */
    for (i = 0; i < set->count; i++) {
        if (set->objs[i] == object) {
            break;
        }
    }
    LY_CHECK_ERR_RET((i == set->count), LOGARG(NULL, object), LY_EINVAL); /* object is not in set */

    return ly_set_rm_index(set, i, destructor);
}